

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void emit_ARB1_TEXM3X3TEX(Context *ctx)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  RegisterList *pRVar4;
  size_t buflen;
  RegisterList *extraout_RDX;
  RegisterList *pRVar5;
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  char dst [64];
  char src4 [64];
  char src3 [64];
  char src2 [64];
  char src1 [64];
  char src0 [64];
  char local_1b8 [64];
  char local_178 [64];
  char local_138 [64];
  char local_f8 [64];
  char local_b8 [64];
  char local_78 [72];
  
  if (ctx->texm3x3pad_src1 != -1) {
    uVar1 = (ctx->dest_arg).regnum;
    pcVar8 = "t";
    pcVar7 = "t";
    if (ctx->shader_type == MOJOSHADER_TYPE_VERTEX) {
      pcVar7 = "a";
    }
    snprintf(local_1b8,0x10,"%u",(ulong)(uint)ctx->texm3x3pad_dst0);
    snprintf(local_78,0x40,"%s%s",pcVar7,local_1b8);
    pcVar7 = "t";
    if (ctx->shader_type == MOJOSHADER_TYPE_VERTEX) {
      pcVar7 = "a";
    }
    snprintf(local_1b8,0x10,"%u",(ulong)(uint)ctx->texm3x3pad_src0);
    snprintf(local_b8,0x40,"%s%s",pcVar7,local_1b8);
    pcVar7 = "t";
    if (ctx->shader_type == MOJOSHADER_TYPE_VERTEX) {
      pcVar7 = "a";
    }
    snprintf(local_1b8,0x10,"%u",(ulong)(uint)ctx->texm3x3pad_dst1);
    snprintf(local_f8,0x40,"%s%s",pcVar7,local_1b8);
    pcVar7 = "t";
    if (ctx->shader_type == MOJOSHADER_TYPE_VERTEX) {
      pcVar7 = "a";
    }
    snprintf(local_1b8,0x10,"%u",(ulong)(uint)ctx->texm3x3pad_src1);
    snprintf(local_138,0x40,"%s%s",pcVar7,local_1b8);
    if (ctx->shader_type == MOJOSHADER_TYPE_VERTEX) {
      pcVar8 = "a";
    }
    snprintf(local_1b8,0x10,"%u",(ulong)(uint)ctx->source_args[0].regnum);
    snprintf(local_178,0x40,"%s%s",pcVar8,local_1b8);
    get_ARB1_destarg_varname(ctx,local_1b8,buflen);
    uVar3 = uVar1 | 0xa0000;
    pRVar4 = (ctx->samplers).next;
    pRVar5 = extraout_RDX;
    do {
      if (pRVar4 == (RegisterList *)0x0) {
        pRVar5 = (RegisterList *)0x0;
        break;
      }
      uVar6 = pRVar4->regtype << 0x10 | pRVar4->regnum;
      if (uVar3 == uVar6) {
        bVar2 = false;
        pRVar5 = pRVar4;
      }
      else if (uVar3 < uVar6) {
        pRVar5 = (RegisterList *)0x0;
        bVar2 = false;
      }
      else {
        pRVar4 = pRVar4->next;
        bVar2 = true;
      }
    } while (bVar2);
    if (pRVar5 == (RegisterList *)0x0) {
      pcVar7 = "3D";
    }
    else {
      pcVar7 = "3D";
      if (pRVar5->index == 3) {
        pcVar7 = "CUBE";
      }
    }
    output_line(ctx,"DP3 %s.z, %s, %s;",local_1b8,local_1b8,local_178);
    output_line(ctx,"DP3 %s.x, %s, %s;",local_1b8,local_78,local_b8);
    output_line(ctx,"DP3 %s.y, %s, %s;",local_1b8,local_f8,local_138);
    output_line(ctx,"TEX %s, %s, texture[%d], %s;",local_1b8,local_1b8,(ulong)uVar1,pcVar7);
    emit_ARB1_dest_modifiers(ctx);
  }
  return;
}

Assistant:

static void emit_ARB1_TEXM3X3TEX(Context *ctx)
{
    if (ctx->texm3x3pad_src1 == -1)
        return;

    char dst[64];
    char src0[64];
    char src1[64];
    char src2[64];
    char src3[64];
    char src4[64];

    // !!! FIXME: this code counts on the register not having swizzles, etc.
    const int stage = ctx->dest_arg.regnum;
    get_ARB1_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x3pad_dst0,
                            src0, sizeof (src0));
    get_ARB1_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x3pad_src0,
                            src1, sizeof (src1));
    get_ARB1_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x3pad_dst1,
                            src2, sizeof (src2));
    get_ARB1_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x3pad_src1,
                            src3, sizeof (src3));
    get_ARB1_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->source_args[0].regnum,
                            src4, sizeof (src4));
    get_ARB1_destarg_varname(ctx, dst, sizeof (dst));

    RegisterList *sreg = reglist_find(&ctx->samplers, REG_TYPE_SAMPLER, stage);
    const TextureType ttype = (TextureType) (sreg ? sreg->index : 0);
    const char *ttypestr = (ttype == TEXTURE_TYPE_CUBE) ? "CUBE" : "3D";

    output_line(ctx, "DP3 %s.z, %s, %s;", dst, dst, src4);
    output_line(ctx, "DP3 %s.x, %s, %s;", dst, src0, src1);
    output_line(ctx, "DP3 %s.y, %s, %s;", dst, src2, src3);
    output_line(ctx, "TEX %s, %s, texture[%d], %s;", dst, dst, stage, ttypestr);
    emit_ARB1_dest_modifiers(ctx);
}